

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::create_response_map(Surf *this,int o,int k)

{
  int fs;
  int iVar1;
  int iVar2;
  element_type *peVar3;
  float fVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  SatType SVar8;
  SatType SVar9;
  SatType SVar10;
  long lVar11;
  int x;
  int iVar12;
  int y;
  int iVar13;
  float fVar14;
  undefined1 local_70 [8];
  Ptr img;
  
  fs = *(int *)((anonymous_namespace)::kernel_sizes + (long)k * 4 + (long)o * 0x10);
  local_70._0_4_ = 2;
  iVar6 = math::fastpow<int>((int *)local_70,o);
  fVar4 = 1.0 / (float)((fs * 2 + -1) * fs);
  peVar3 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (peVar3->super_TypedImageBase<long>).super_ImageBase.w;
  iVar2 = (peVar3->super_TypedImageBase<long>).super_ImageBase.h;
  iVar12 = iVar2;
  iVar13 = 0;
  iVar7 = iVar1;
  if (0 < o) {
    iVar13 = o;
  }
  while (iVar13 != 0) {
    iVar12 = iVar12 + 1 >> 1;
    iVar13 = iVar13 + -1;
    iVar7 = iVar7 + 1 >> 1;
  }
  core::Image<float>::create((Image<float> *)local_70,iVar7,iVar12,1);
  img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(fs / 2 + fs + 1);
  iVar12 = fs / 2 + fs;
  lVar11 = 0;
  for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + iVar6) {
    iVar7 = (int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
    lVar5 = CONCAT44(local_70._4_4_,local_70._0_4_);
    lVar11 = (long)(int)lVar11;
    for (x = 0; x < iVar1; x = x + iVar6) {
      fVar14 = 0.0;
      if ((((iVar12 < iVar13) && (iVar12 < x)) &&
          ((int)img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + x < iVar1)) && (iVar7 + iVar13 < iVar2)) {
        SVar8 = filter_dxx(this,fs,x,iVar13);
        SVar9 = filter_dyy(this,fs,x,iVar13);
        SVar10 = filter_dxy(this,fs,x,iVar13);
        fVar14 = (float)SVar10 * fVar4 * -0.912 * (float)SVar10 * fVar4 +
                 (float)SVar9 * fVar4 * (float)SVar8 * fVar4;
      }
      *(float *)(*(long *)(lVar5 + 0x18) + lVar11 * 4) = fVar14;
      lVar11 = lVar11 + 1;
    }
  }
  std::__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)k * 0x10 +
             *(long *)&(this->octaves).
                       super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                       ._M_impl.super__Vector_impl_data._M_start[o].imgs.
                       super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                       ._M_impl),
             (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
  return;
}

Assistant:

void
Surf::create_response_map (int o, int k)
{
    /*
     * In order to create the Hessian response map for filter size 'fs',
     * we need to convolute the image with second order Gaussian partial
     * derivative filters Dxx, Dyy and Dxy and compute the response
     * as det(H) = Dxx * Dyy - w * Dxy * Dxy, where w = 0.81.
     * So we need to compute Dxx, Dyy and Dxy with filter size 'fs'.
     * Note: filter size 'fs' is defined as filter width / 3.
     * For details, see SURF 3.2.
     */
    typedef Octave::RespType RespType;

    /* Filter size. The actual kernel side length is 3 * fs. */
    int const fs = kernel_sizes[o][k];
    /* The sample spacing for the octaves. */
    int const step = math::fastpow(2, o);
    /* Weight to balance between real gaussian kernel and approximated one. */
    RespType const weight = 0.912;  // See SURF 3.3 (4).
    /* NormalizationKernel width is 3 * fs, height is 2 * fs - 1. */
    RespType const inv_karea = 1.0 / (fs * (2 * fs - 1));

    /* Original dimensions and octave dimensions. */
    int const w = this->sat->width();
    int const h = this->sat->height();
    int ow = w;
    int oh = h;
    for (int i = 0; i < o; ++i)
    {
        ow = (ow + 1) >> 1;
        oh = (oh + 1) >> 1;
    }

    /* Generate the response maps. */
    Octave::RespImage::Ptr img = Octave::RespImage::create(ow, oh, 1);
    int const border = fs + fs / 2 + 1;
    for (int y = 0, i = 0; y < h; y += step)
        for (int x = 0; x < w; x += step, ++i)
        {
            if (x < border || x + border >= w || y < border || y + border >= h)
            {
                img->at(i) = 0.0f;
                continue;
            }

            SatType dxx = this->filter_dxx(fs, x, y);
            SatType dyy = this->filter_dyy(fs, x, y);
            SatType dxy = this->filter_dxy(fs, x, y);
            RespType dxx_t = static_cast<RespType>(dxx) * inv_karea;
            RespType dyy_t = static_cast<RespType>(dyy) * inv_karea;
            RespType dxy_t = static_cast<RespType>(dxy) * inv_karea;
            /* Compute the determinant of the hessian. */
            img->at(i) = dxx_t * dyy_t - weight * dxy_t * dxy_t;
            /* The laplacian can be computed as dxx_t + dyy_t. */
            // float laplacian = dxx_t + dyy_t;
        }

    this->octaves[o].imgs[k] = img;
}